

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O1

bool RigidBodyDynamics::CalcAssemblyQ
               (Model *model,VectorNd *QInit,ConstraintSet *cs,VectorNd *Q,VectorNd *weights,
               double tolerance,uint max_iter)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  uint uVar6;
  pointer pJVar7;
  pointer puVar8;
  double dVar9;
  double dVar10;
  undefined8 uVar11;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pPVar12;
  RBDLDofMismatchError *pRVar13;
  undefined8 *puVar14;
  double *pdVar15;
  ulong uVar16;
  bool bVar17;
  Index othersize;
  ulong uVar18;
  double *pdVar19;
  long lVar20;
  double *pdVar21;
  double *pdVar22;
  Index row;
  ulong uVar23;
  uint uVar24;
  ActualDstType actualDst;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  VectorNd e;
  VectorNd d;
  VectorNd b;
  VectorNd x;
  MatrixNd constraintJac;
  MatrixNd A;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  assign_op<double,_double> local_1a9;
  undefined1 local_1a8 [16];
  DstEvaluatorType local_198;
  uint local_17c;
  undefined1 local_178 [24];
  long lStack_160;
  DenseStorage<double,__1,__1,__1,_0> local_158;
  double local_138;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_130;
  Matrix<double,__1,__1,_0,__1,__1> local_110;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_f8;
  DstEvaluatorType local_f0;
  DstXprType local_d8;
  SrcEvaluatorType local_a0;
  string local_90;
  string local_70;
  string local_50;
  
  local_17c = max_iter;
  local_138 = tolerance;
  if ((Q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      (ulong)model->q_size) {
    pRVar13 = (RBDLDofMismatchError *)__cxa_allocate_exception(0x28);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Incorrect Q vector size.\n","");
    Errors::RBDLDofMismatchError::RBDLDofMismatchError(pRVar13,&local_50);
    __cxa_throw(pRVar13,&Errors::RBDLDofMismatchError::typeinfo,Errors::RBDLError::~RBDLError);
  }
  if ((QInit->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      (ulong)model->q_size) {
    pRVar13 = (RBDLDofMismatchError *)__cxa_allocate_exception(0x28);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Incorrect QInit vector size.\n","");
    Errors::RBDLDofMismatchError::RBDLDofMismatchError(pRVar13,&local_70);
    __cxa_throw(pRVar13,&Errors::RBDLDofMismatchError::typeinfo,Errors::RBDLError::~RBDLError);
  }
  uVar18 = CONCAT44(0,model->dof_count);
  if ((weights->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      uVar18) {
    pRVar13 = (RBDLDofMismatchError *)__cxa_allocate_exception(0x28);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Incorrect weights vector size.\n","");
    Errors::RBDLDofMismatchError::RBDLDofMismatchError(pRVar13,&local_90);
    __cxa_throw(pRVar13,&Errors::RBDLDofMismatchError::typeinfo,Errors::RBDLError::~RBDLError);
  }
  lVar20 = *(long *)(cs + 0x10) - *(long *)(cs + 8) >> 2;
  local_158.m_data = (double *)0x0;
  local_158.m_rows = 0;
  local_158.m_cols = 0;
  if ((uVar18 != 0 && *(long *)(cs + 0x10) - *(long *)(cs + 8) != 0) &&
     (auVar29._8_8_ = 0, auVar29._0_8_ = uVar18,
     auVar27 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar27 / auVar29,0) < lVar20)) {
    puVar14 = (undefined8 *)__cxa_allocate_exception(8,QInit,SUB168(auVar27 % auVar29,0));
    *puVar14 = operator_new;
    __cxa_throw(puVar14,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_158,lVar20 * uVar18,lVar20,uVar18);
  local_d8.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
       (PointerType)((ulong)model->dof_count + (*(long *)(cs + 0x10) - *(long *)(cs + 8) >> 2));
  local_d8.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
  m_value = 0;
  local_d8.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
  m_value = (long)local_d8.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                  .m_data;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_110,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_d8);
  lVar20 = (ulong)model->dof_count + (*(long *)(cs + 0x10) - *(long *)(cs + 8) >> 2);
  local_178._0_8_ = (double *)0x0;
  local_178._8_8_ = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_178,lVar20,1);
  if (local_178._8_8_ != lVar20) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_178,lVar20,1);
  }
  if (0 < (long)local_178._8_8_) {
    memset((void *)local_178._0_8_,0,local_178._8_8_ << 3);
  }
  lVar20 = (ulong)model->dof_count + (*(long *)(cs + 0x10) - *(long *)(cs + 8) >> 2);
  local_178._16_8_ = (void *)0x0;
  lStack_160 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(local_178 + 0x10),lVar20,1
            );
  if (lStack_160 != lVar20) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(local_178 + 0x10),lVar20
               ,1);
  }
  if (0 < lStack_160) {
    memset((void *)local_178._16_8_,0,lStack_160 << 3);
  }
  uVar18 = (ulong)model->dof_count;
  local_198.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  .m_data = (double *)0x0;
  local_198.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  ._8_8_ = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(local_1a8 + 0x10),uVar18,1
            );
  if (local_198.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
      .
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
      ._8_8_ != uVar18) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(local_1a8 + 0x10),uVar18
               ,1);
  }
  if (0 < (long)local_198.
                super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                .
                super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                ._8_8_) {
    memset(local_198.
           super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           .m_data,0,
           local_198.
           super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           ._8_8_ << 3);
  }
  lVar20 = *(long *)(cs + 0x10) - *(long *)(cs + 8) >> 2;
  local_1a8._0_8_ = (double *)0x0;
  local_1a8._8_8_ = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1a8,lVar20,1);
  if (local_1a8._8_8_ != lVar20) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1a8,lVar20,1);
  }
  if (0 < (long)local_1a8._8_8_) {
    memset((void *)local_1a8._0_8_,0,local_1a8._8_8_ << 3);
  }
  lVar20 = (weights->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_rows;
  if (0 < lVar20) {
    pdVar19 = (weights->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    uVar18 = 0;
    pdVar15 = local_110.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data;
    do {
      *pdVar15 = pdVar19[uVar18];
      uVar18 = uVar18 + 1;
      pdVar15 = pdVar15 + local_110.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          .m_storage.m_rows + 1;
    } while ((long)(uVar18 & 0xffffffff) < lVar20);
  }
  CalcConstraintsPositionError(model,QInit,cs,(VectorNd *)local_1a8,true);
  local_130.m_dst = (DstEvaluatorType *)local_1a8;
  if (local_1a8._8_8_ == 0) {
    dVar25 = 0.0;
  }
  else {
    local_d8.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
    m_value = local_1a8._0_8_;
    dVar25 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
             ::
             run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                       ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)&local_d8,(scalar_sum_op<double,_double> *)&local_f0,
                        (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                         *)&local_130);
  }
  if (local_138 <= SQRT(dVar25)) {
    local_f8 = &Q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
    if (local_17c != 0) {
      uVar24 = 0;
      do {
        if (0 < local_158.m_cols * local_158.m_rows) {
          memset(local_158.m_data,0,local_158.m_cols * local_158.m_rows * 8);
        }
        CalcConstraintsJacobian(model,QInit,cs,(MatrixNd *)&local_158,true);
        local_d8.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
        m_cols.m_value = (long)model->dof_count;
        local_d8.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
        m_rows.m_value = *(long *)(cs + 0x10) - *(long *)(cs + 8) >> 2;
        local_f0.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_data = local_110.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data +
                  local_d8.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                  .m_cols.m_value;
        local_d8.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
             &local_110;
        local_d8.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        m_startCol.m_value = 0;
        local_d8.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        m_outerStride =
             local_110.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
        local_a0.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
        .m_d.data = local_158.m_data;
        local_a0.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
        .m_d.m_outerStride = local_158.m_rows;
        local_f0.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_outerStride.m_value =
             local_110.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
        local_130.m_dst = &local_f0;
        local_130.m_src = &local_a0;
        local_130.m_functor = &local_1a9;
        local_130.m_dstExpr = &local_d8;
        local_d8.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
        m_data = local_f0.
                 super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .
                 super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 .m_data;
        local_d8.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        m_startRow.m_value =
             local_d8.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
             .m_cols.m_value;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
        ::run(&local_130);
        uVar5 = model->dof_count;
        local_d8.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        m_startRow.m_value = (long)uVar5;
        local_d8.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
        m_rows.m_value = *(long *)(cs + 0x10) - *(long *)(cs + 8) >> 2;
        if (0 < local_d8.
                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                .
                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                .
                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                .m_rows.m_value) {
          pdVar15 = local_110.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data +
                    local_110.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows *
                    local_d8.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                    .m_startRow.m_value;
          pdVar21 = (double *)0x0;
          pdVar19 = local_158.m_data;
          do {
            if (uVar5 != 0) {
              uVar18 = 0;
              pdVar22 = pdVar19;
              do {
                pdVar15[uVar18] = *pdVar22;
                uVar18 = uVar18 + 1;
                pdVar22 = pdVar22 + local_158.m_rows;
              } while (local_d8.
                       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                       .m_startRow.m_value != uVar18);
            }
            pdVar21 = (double *)((long)pdVar21 + 1);
            pdVar19 = pdVar19 + 1;
            pdVar15 = pdVar15 + local_110.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_rows;
          } while (pdVar21 !=
                   (double *)
                   local_d8.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                   .m_rows.m_value);
        }
        local_f0.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_data = (PointerType)
                  (local_178._0_8_ +
                  local_d8.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                  .m_startRow.m_value * 8);
        local_d8.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
        m_cols.m_value = 1;
        local_d8.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        m_startCol.m_value = 0;
        local_d8.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        m_outerStride = local_178._8_8_;
        local_a0.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
        .m_d.m_outerStride = local_1a8._0_8_;
        local_f0.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_outerStride.m_value = local_178._8_8_;
        local_130.m_dst = &local_f0;
        local_130.m_src = &local_a0;
        local_130.m_functor = &local_1a9;
        local_130.m_dstExpr = &local_d8;
        local_d8.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
        m_data = local_f0.
                 super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .
                 super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 .m_data;
        local_d8.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
             (XprTypeNested)local_178;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
               *)&local_130);
        SolveLinearSystem(&local_110,(VectorNd *)local_178,(VectorNd *)(local_178 + 0x10),
                          *(LinearSolver *)cs);
        uVar11 = local_178._16_8_;
        if (local_198.
            super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
            ._8_8_ != (ulong)model->dof_count) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(local_1a8 + 0x10),
                     (ulong)model->dof_count,1);
        }
        uVar18 = local_198.
                 super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .
                 super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 ._8_8_ & 0xfffffffffffffffe;
        if (0 < (long)uVar18) {
          lVar20 = 0;
          do {
            *(undefined1 (*) [16])
             ((long)local_198.
                    super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                    .
                    super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    .m_data + lVar20 * 8) = *(undefined1 (*) [16])(uVar11 + lVar20 * 8);
            lVar20 = lVar20 + 2;
          } while (lVar20 < (long)uVar18);
        }
        if (uVar18 != local_198.
                      super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .
                      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                      ._8_8_) {
          do {
            *(double *)
             ((long)local_198.
                    super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                    .
                    super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    .m_data + uVar18 * 8) = *(double *)(uVar11 + uVar18 * 8);
            uVar18 = uVar18 + 1;
          } while ((long)uVar18 <
                   (long)local_198.
                         super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                         .
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                         ._8_8_);
        }
        pJVar7 = (model->mJoints).
                 super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar20 = (long)(model->mJoints).
                       super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pJVar7;
        if (lVar20 != 0) {
          lVar20 = (lVar20 >> 3) * -0x5555555555555555;
          puVar8 = (model->multdof3_w_index).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar18 = 0;
          do {
            if (pJVar7[uVar18].mJointType == JointTypeSpherical) {
              uVar5 = pJVar7[uVar18 & 0xffffffff].q_index;
              pdVar15 = (QInit->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data;
              uVar6 = puVar8[uVar18 & 0xffffffff];
              dVar25 = pdVar15[uVar5];
              dVar1 = pdVar15[uVar5 + 1];
              dVar2 = pdVar15[uVar5 + 2];
              dVar3 = pdVar15[uVar6];
              pdVar19 = (double *)
                        ((long)local_198.
                               super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                               .
                               super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                               .m_data + (ulong)pJVar7[uVar18].q_index * 8);
              dVar9 = *pdVar19;
              dVar10 = pdVar19[1];
              dVar4 = ((double *)
                      ((long)local_198.
                             super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                             .
                             super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                             .m_data + 0x10))[pJVar7[uVar18].q_index];
              auVar27._0_8_ =
                   dVar1 * 0.5 * dVar4 + -dVar2 * 0.5 * dVar10 + dVar3 * 0.5 * dVar9 + dVar25;
              auVar27._8_8_ =
                   -dVar25 * 0.5 * dVar4 + dVar3 * 0.5 * dVar10 + dVar2 * 0.5 * dVar9 + dVar1;
              auVar26._0_8_ =
                   dVar3 * 0.5 * dVar4 + dVar25 * 0.5 * dVar10 + dVar1 * -0.5 * dVar9 + dVar2;
              auVar26._8_8_ =
                   -dVar2 * 0.5 * dVar4 + -dVar1 * 0.5 * dVar10 + dVar25 * -0.5 * dVar9 + dVar3;
              auVar28._0_8_ =
                   auVar26._8_8_ * auVar26._8_8_ + auVar27._8_8_ * auVar27._8_8_ +
                   auVar26._0_8_ * auVar26._0_8_ + auVar27._0_8_ * auVar27._0_8_;
              auVar28._8_8_ = 0;
              auVar29 = sqrtpd(auVar28,auVar28);
              auVar30._0_8_ = auVar29._0_8_;
              auVar30._8_8_ = auVar30._0_8_;
              auVar29 = divpd(auVar27,auVar30);
              auVar27 = divpd(auVar26,auVar30);
              pdVar15[uVar5] = auVar29._0_8_;
              pdVar15[uVar5 + 1] = auVar29._8_8_;
              pdVar15[uVar5 + 2] = auVar27._0_8_;
              pdVar15[uVar6] = auVar27._8_8_;
            }
            else {
              uVar5 = pJVar7[uVar18].mDoFCount;
              if ((ulong)uVar5 != 0) {
                uVar16 = (ulong)pJVar7[uVar18].q_index;
                pdVar19 = (QInit->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                          m_storage.m_data;
                uVar23 = 0;
                do {
                  pdVar19[uVar16 + uVar23] =
                       ((double *)
                       ((long)local_198.
                              super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                              .
                              super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                              .m_data + uVar16 * 8))[uVar23] + pdVar19[uVar16 + uVar23];
                  uVar23 = uVar23 + 1;
                } while (uVar5 != uVar23);
              }
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != lVar20 + (ulong)(lVar20 == 0));
        }
        CalcConstraintsPositionError(model,QInit,cs,(VectorNd *)local_1a8,true);
        local_130.m_dst = (DstEvaluatorType *)local_1a8;
        if (local_1a8._8_8_ == 0) {
          dVar25 = 0.0;
        }
        else {
          local_d8.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
          m_rows.m_value = local_1a8._0_8_;
          dVar25 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                   ::
                   run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                             ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               *)&local_d8,(scalar_sum_op<double,_double> *)&local_f0,
                              (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                               *)&local_130);
        }
        if (SQRT(dVar25) < local_138) {
          local_130.m_dst = (DstEvaluatorType *)(local_1a8 + 0x10);
          if (local_198.
              super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              ._8_8_ == 0) {
            dVar25 = 0.0;
          }
          else {
            local_d8.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
            m_rows.m_value =
                 (long)local_198.
                       super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                       .
                       super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       .m_data;
            dVar25 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)&local_d8,(scalar_sum_op<double,_double> *)&local_f0,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                 *)&local_130);
          }
          pPVar12 = local_f8;
          if (SQRT(dVar25) < local_138) {
            pdVar19 = (QInit->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            lVar20 = (QInit->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_rows;
            if ((local_f8->m_storage).m_rows != lVar20) {
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (local_f8,lVar20,1);
            }
            pdVar15 = (pPVar12->m_storage).m_data;
            uVar18 = (pPVar12->m_storage).m_rows;
            uVar16 = uVar18 - ((long)uVar18 >> 0x3f) & 0xfffffffffffffffe;
            if (1 < (long)uVar18) {
              lVar20 = 0;
              do {
                pdVar21 = pdVar19 + lVar20;
                dVar25 = pdVar21[1];
                pdVar22 = pdVar15 + lVar20;
                *pdVar22 = *pdVar21;
                pdVar22[1] = dVar25;
                lVar20 = lVar20 + 2;
              } while (lVar20 < (long)uVar16);
            }
            bVar17 = true;
            if ((long)uVar16 < (long)uVar18) {
              do {
                pdVar15[uVar16] = pdVar19[uVar16];
                uVar16 = uVar16 + 1;
              } while (uVar18 != uVar16);
            }
            goto LAB_0013c029;
          }
        }
        uVar24 = uVar24 + 1;
      } while (uVar24 != local_17c);
    }
    pPVar12 = local_f8;
    pdVar19 = (QInit->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    lVar20 = (QInit->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if ((local_f8->m_storage).m_rows != lVar20) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(local_f8,lVar20,1);
    }
    pdVar15 = (pPVar12->m_storage).m_data;
    uVar18 = (pPVar12->m_storage).m_rows;
    uVar16 = uVar18 - ((long)uVar18 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar18) {
      lVar20 = 0;
      do {
        pdVar21 = pdVar19 + lVar20;
        dVar25 = pdVar21[1];
        pdVar22 = pdVar15 + lVar20;
        *pdVar22 = *pdVar21;
        pdVar22[1] = dVar25;
        lVar20 = lVar20 + 2;
      } while (lVar20 < (long)uVar16);
    }
    if ((long)uVar16 < (long)uVar18) {
      do {
        pdVar15[uVar16] = pdVar19[uVar16];
        uVar16 = uVar16 + 1;
      } while (uVar18 != uVar16);
    }
    bVar17 = false;
  }
  else {
    pdVar19 = (QInit->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    lVar20 = (QInit->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if ((Q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
        lVar20) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&Q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar20,1);
    }
    pdVar15 = (Q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    uVar18 = (Q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    uVar16 = uVar18 - ((long)uVar18 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar18) {
      lVar20 = 0;
      do {
        pdVar21 = pdVar19 + lVar20;
        dVar25 = pdVar21[1];
        pdVar22 = pdVar15 + lVar20;
        *pdVar22 = *pdVar21;
        pdVar22[1] = dVar25;
        lVar20 = lVar20 + 2;
      } while (lVar20 < (long)uVar16);
    }
    bVar17 = true;
    if ((long)uVar16 < (long)uVar18) {
      do {
        pdVar15[uVar16] = pdVar19[uVar16];
        uVar16 = uVar16 + 1;
      } while (uVar18 != uVar16);
    }
  }
LAB_0013c029:
  free((void *)local_1a8._0_8_);
  free(local_198.
       super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
       super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
       .m_data);
  free((void *)local_178._16_8_);
  free((void *)local_178._0_8_);
  free(local_110.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_158.m_data);
  return bVar17;
}

Assistant:

RBDL_DLLAPI
bool CalcAssemblyQ (
  Model &model,
  Math::VectorNd QInit, // Note: passed by value intentionally
  ConstraintSet &cs,
  Math::VectorNd &Q,
  const Math::VectorNd &weights,
  double tolerance,
  unsigned int max_iter
)
{

  if(Q.size() != model.q_size) {
    throw Errors::RBDLDofMismatchError("Incorrect Q vector size.\n");
  }
  if(QInit.size() != model.q_size) {
    throw Errors::RBDLDofMismatchError("Incorrect QInit vector size.\n");
  }
  if(weights.size() != model.dof_count) {
    throw Errors::RBDLDofMismatchError("Incorrect weights vector size.\n");
  }

  // Initialize variables.
  MatrixNd constraintJac (cs.size(), model.dof_count);
  MatrixNd A = MatrixNd::Zero (cs.size() + model.dof_count, cs.size()
                               + model.dof_count);
  VectorNd b = VectorNd::Zero (cs.size() + model.dof_count);
  VectorNd x = VectorNd::Zero (cs.size() + model.dof_count);
  VectorNd d = VectorNd::Zero (model.dof_count);
  VectorNd e = VectorNd::Zero (cs.size());

  // The top-left block is the weight matrix and is constant.
  for(unsigned int i = 0; i < weights.size(); ++i) {
    A(i,i) = weights[i];
  }

  // Check if the error is small enough already. If so, just return the initial
  // guess as the solution.
  CalcConstraintsPositionError (model, QInit, cs, e);
  if (e.norm() < tolerance) {
    Q = QInit;
    return true;
  }

  // We solve the linearized problem iteratively.
  // Iterations are stopped if the maximum is reached.
  for(unsigned int it = 0; it < max_iter; ++it) {
    // Compute the constraint jacobian and build A and b.
    constraintJac.setZero();
    CalcConstraintsJacobian (model, QInit, cs, constraintJac);
    A.block (model.dof_count, 0, cs.size(), model.dof_count) = constraintJac;
    A.block (0, model.dof_count, model.dof_count, cs.size())
      = constraintJac.transpose();
    b.block (model.dof_count, 0, cs.size(), 1) = -e;

    // Solve the sistem A*x = b.
    SolveLinearSystem (A, b, x, cs.linear_solver);

    // Extract the d = (Q - QInit) vector from x.
    d = x.block (0, 0, model.dof_count, 1);

    // Update solution.
    for (size_t i = 0; i < model.mJoints.size(); ++i) {
      // If the joint is spherical, translate the corresponding components
      // of d into a modification in the joint quaternion.
      if (model.mJoints[i].mJointType == JointTypeSpherical) {
        Quaternion quat = model.GetQuaternion(i, QInit);
        Vector3d omega = d.block<3,1>(model.mJoints[i].q_index,0);
        // Convert the 3d representation of the displacement to 4d and sum it
        // to the components of the quaternion.
        quat += quat.omegaToQDot(omega);
        // The quaternion needs to be normalized after the previous sum.
        quat /= quat.norm();
        model.SetQuaternion(i, quat, QInit);
      }
      // If the current joint is not spherical, simply add the corresponding
      // components of d to QInit.
      else {
        unsigned int qIdx = model.mJoints[i].q_index;
        for(size_t j = 0; j < model.mJoints[i].mDoFCount; ++j) {
          QInit[qIdx + j] += d[qIdx + j];
        }
      }
    }

    // Update the errors.
    CalcConstraintsPositionError (model, QInit, cs, e);

    // Check if the error and the step are small enough to end.
    if (e.norm() < tolerance && d.norm() < tolerance) {
      Q = QInit;
      return true;
    }
  }

  // Return false if maximum number of iterations is exceeded.
  Q = QInit;
  return false;
}